

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

BinOpr subexpr(LexState *ls,expdesc *v,uint limit)

{
  unsigned_short *puVar1;
  byte bVar2;
  expkind eVar3;
  int iVar4;
  Instruction *pIVar5;
  OpCode op;
  int iVar6;
  BinOpr BVar7;
  ulong uVar8;
  int *l1;
  FuncState *pFVar9;
  expdesc v2;
  
  enterlevel(ls);
  iVar6 = (ls->t).token;
  switch(iVar6) {
  case 0x107:
    v->t = -1;
    v->f = -1;
    v->k = VFALSE;
    goto LAB_0010bda6;
  case 0x108:
  case 0x10a:
  case 0x10b:
  case 0x10c:
switchD_0010bd3b_caseD_108:
    primaryexp(ls,v);
    break;
  case 0x109:
    luaX_next(ls);
    body(ls,v,0,ls->linenumber);
    break;
  case 0x10d:
    v->t = -1;
    v->f = -1;
    v->k = VNIL;
LAB_0010bda6:
    (v->u).s.info = 0;
LAB_0010bec0:
    luaX_next(ls);
    break;
  case 0x10e:
    iVar6 = 1;
LAB_0010bdb3:
    luaX_next(ls);
    subexpr(ls,v,8);
    pFVar9 = ls->fs;
    v2.t = -1;
    v2.f = -1;
    v2.k = VKNUM;
    v2.u.nval = 0.0;
    if (iVar6 == 2) {
      luaK_exp2anyreg(pFVar9,v);
      op = OP_LEN;
    }
    else {
      if (iVar6 == 1) {
        luaK_dischargevars(pFVar9,v);
        switch(v->k) {
        case VNIL:
        case VFALSE:
          v->k = VTRUE;
          break;
        case VTRUE:
        case VK:
        case VKNUM:
          v->k = VFALSE;
          break;
        case VJMP:
          invertjump(pFVar9,v);
          break;
        case VRELOCABLE:
        case VNONRELOC:
          discharge2anyreg(pFVar9,v);
          freeexp(pFVar9,v);
          iVar6 = luaK_codeABC(pFVar9,OP_NOT,0,(v->u).s.info,0);
          (v->u).s.info = iVar6;
          v->k = VRELOCABLE;
        }
        iVar6 = v->t;
        iVar4 = v->f;
        v->f = iVar6;
        v->t = iVar4;
        removevalues(pFVar9,iVar6);
        removevalues(pFVar9,v->t);
        break;
      }
      iVar6 = isnumeral(v);
      if (iVar6 == 0) {
        luaK_exp2anyreg(pFVar9,v);
      }
      op = OP_UNM;
    }
    codearith(pFVar9,op,v,&v2);
    break;
  default:
    if (iVar6 == 0x23) {
      iVar6 = 2;
      goto LAB_0010bdb3;
    }
    if (iVar6 == 0x11e) {
      codestring(ls,v,(ls->t).seminfo.ts);
    }
    else {
      if (iVar6 == 0x7b) {
        constructor(ls,v);
        break;
      }
      if (iVar6 == 0x113) {
        v->t = -1;
        v->f = -1;
        v->k = VTRUE;
        goto LAB_0010bda6;
      }
      if (iVar6 == 0x117) {
        pFVar9 = ls->fs;
        bVar2 = pFVar9->f->is_vararg;
        if (bVar2 == 0) {
          luaX_syntaxerror(ls,"cannot use \'...\' outside a vararg function");
        }
        pFVar9->f->is_vararg = bVar2 & 0xfb;
        iVar6 = luaK_code(pFVar9,0x800025,pFVar9->ls->lastline);
        v->t = -1;
        v->f = -1;
        v->k = VVARARG;
        (v->u).s.info = iVar6;
      }
      else {
        if (iVar6 != 0x11c) {
          if (iVar6 != 0x2d) goto switchD_0010bd3b_caseD_108;
          iVar6 = 0;
          goto LAB_0010bdb3;
        }
        v->t = -1;
        v->f = -1;
        v->k = VKNUM;
        (v->u).s.info = 0;
        v->u = (anon_union_8_2_fd02c123_for_u)(ls->t).seminfo;
      }
    }
    goto LAB_0010bec0;
  }
  iVar6 = (ls->t).token;
  switch(iVar6) {
  case 0x10f:
    BVar7 = OPR_OR;
    break;
  case 0x110:
  case 0x111:
  case 0x112:
  case 0x113:
  case 0x114:
  case 0x115:
  case 0x117:
    goto switchD_0010beec_caseD_26;
  case 0x116:
    BVar7 = OPR_CONCAT;
    break;
  case 0x118:
    BVar7 = OPR_EQ;
    break;
  case 0x119:
    BVar7 = OPR_GE;
    break;
  case 0x11a:
    BVar7 = OPR_LE;
    break;
  case 0x11b:
    BVar7 = OPR_NE;
    break;
  default:
    switch(iVar6) {
    case 0x25:
      BVar7 = OPR_MOD;
      break;
    case 0x2a:
      BVar7 = OPR_MUL;
      break;
    case 0x2b:
      BVar7 = OPR_ADD;
      break;
    case 0x2d:
      BVar7 = OPR_SUB;
      break;
    case 0x2f:
      BVar7 = OPR_DIV;
      break;
    default:
      if (iVar6 == 0x3c) {
        BVar7 = OPR_LT;
        break;
      }
      if (iVar6 == 0x3e) {
        BVar7 = OPR_GT;
        break;
      }
      if (iVar6 == 0x5e) {
        BVar7 = OPR_POW;
        break;
      }
      if (iVar6 == 0x101) {
        BVar7 = OPR_AND;
        break;
      }
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2c:
    case 0x2e:
switchD_0010beec_caseD_26:
      BVar7 = OPR_NOBINOPR;
    }
  }
  do {
    if ((BVar7 == OPR_NOBINOPR) || (uVar8 = (ulong)BVar7, priority[uVar8].left <= limit)) {
      puVar1 = &ls->L->nCcalls;
      *puVar1 = *puVar1 - 1;
      return BVar7;
    }
    luaX_next(ls);
    pFVar9 = ls->fs;
    switch(uVar8) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
      iVar6 = isnumeral(v);
      if (iVar6 != 0) goto LAB_0010bfbc;
    default:
      luaK_exp2RK(pFVar9,v);
LAB_0010bfbc:
      subexpr(ls,&v2,(uint)priority[uVar8].right);
      BVar7 = (*(code *)((long)&switchD_0010c363::switchdataD_001122f4 +
                        (long)(int)(&switchD_0010c363::switchdataD_001122f4)
                                   [(long)(&DAT_001122c0 + *(int *)(&DAT_001122c0 + uVar8 * 4))]))()
      ;
      return BVar7;
    case 6:
      luaK_exp2nextreg(pFVar9,v);
      BVar7 = subexpr(ls,&v2,(uint)priority[uVar8].right);
      pFVar9 = ls->fs;
      luaK_exp2val(pFVar9,&v2);
      if ((v2.k == VRELOCABLE) && ((pFVar9->f->code[v2.u.s.info] & 0x3f) == 0x15)) {
        freeexp(pFVar9,v);
        pIVar5 = pFVar9->f->code;
        pIVar5[v2.u.s.info] = (v->u).s.info << 0x17 | pIVar5[v2.u.s.info] & 0x7fffff;
        v->k = VRELOCABLE;
        (v->u).s.info = v2.u.s.info;
      }
      else {
        luaK_exp2nextreg(pFVar9,&v2);
        codearith(pFVar9,OP_CONCAT,v,&v2);
      }
      break;
    case 0xd:
      luaK_goiftrue(pFVar9,v);
      BVar7 = subexpr(ls,&v2,(uint)priority[uVar8].right);
      pFVar9 = ls->fs;
      luaK_dischargevars(pFVar9,&v2);
      iVar6 = v->f;
      l1 = &v2.f;
      goto LAB_0010c1e5;
    case 0xe:
      luaK_dischargevars(pFVar9,v);
      eVar3 = v->k;
      iVar6 = -1;
      if ((eVar3 != VNIL) && (eVar3 != VFALSE)) {
        if (eVar3 == VJMP) {
          iVar6 = (v->u).s.info;
        }
        else {
          iVar6 = jumponcond(pFVar9,v,1);
        }
      }
      luaK_concat(pFVar9,&v->t,iVar6);
      luaK_patchtohere(pFVar9,v->f);
      v->f = -1;
      BVar7 = subexpr(ls,&v2,(uint)priority[uVar8].right);
      pFVar9 = ls->fs;
      luaK_dischargevars(pFVar9,&v2);
      iVar6 = v->t;
      l1 = &v2.t;
LAB_0010c1e5:
      luaK_concat(pFVar9,l1,iVar6);
      v->t = v2.t;
      v->f = v2.f;
      *(ulong *)v = CONCAT44(v2._4_4_,v2.k);
      v->u = v2.u;
    }
  } while( true );
}

Assistant:

static BinOpr subexpr(LexState*ls,expdesc*v,unsigned int limit){
BinOpr op;
UnOpr uop;
enterlevel(ls);
uop=getunopr(ls->t.token);
if(uop!=OPR_NOUNOPR){
luaX_next(ls);
subexpr(ls,v,8);
luaK_prefix(ls->fs,uop,v);
}
else simpleexp(ls,v);
op=getbinopr(ls->t.token);
while(op!=OPR_NOBINOPR&&priority[op].left>limit){
expdesc v2;
BinOpr nextop;
luaX_next(ls);
luaK_infix(ls->fs,op,v);
nextop=subexpr(ls,&v2,priority[op].right);
luaK_posfix(ls->fs,op,v,&v2);
op=nextop;
}
leavelevel(ls);
return op;
}